

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.c
# Opt level: O0

char * loadfile(int fd,int *datasize)

{
  int iVar1;
  __off_t _Var2;
  __off_t _Var3;
  ssize_t sVar4;
  char *data;
  int local_30;
  int ret;
  int bytes_left;
  int len;
  int end;
  int start;
  int *datasize_local;
  char *pcStack_10;
  int fd_local;
  
  if (fd == -1) {
    pcStack_10 = (char *)0x0;
  }
  else {
    _Var2 = lseek(fd,0,1);
    _Var3 = lseek(fd,0,2);
    lseek(fd,(long)(int)_Var2,0);
    iVar1 = (int)_Var3 - (int)_Var2;
    if (iVar1 == 0) {
      pcStack_10 = (char *)0x0;
    }
    else {
      pcStack_10 = (char *)malloc((long)(iVar1 + 1));
      local_30 = iVar1;
      do {
        sVar4 = read(fd,pcStack_10 + (iVar1 - local_30),(long)local_30);
        if ((int)sVar4 == -1) {
          free(pcStack_10);
          return (char *)0x0;
        }
        local_30 = local_30 - (int)sVar4;
      } while (local_30 != 0);
      pcStack_10[iVar1] = '\0';
      *datasize = iVar1;
    }
  }
  return pcStack_10;
}

Assistant:

char *loadfile(int fd, int *datasize)
{
	int start, end, len, bytes_left, ret;
	char *data;
	
	if (fd == -1)
	    return NULL;
	
	start = lseek(fd, 0, SEEK_CUR);
	end = lseek(fd, 0, SEEK_END);
	lseek(fd, start, SEEK_SET);
	
	len = end - start;
	if (len == 0)
	    return NULL;
	
	data = malloc(len + 1);
	bytes_left = len;
	do {
	    /* read may return fewer bytes than requested for reasons that are not errors */
	    ret = read(fd, &data[len - bytes_left], bytes_left);
	    if (ret == -1) {
		free(data);
		return NULL;
	    }
	    
	    bytes_left -= ret;
	} while (bytes_left);
	data[len] = '\0';
	
	*datasize = len;
	return data;
}